

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

void __thiscall
vkt::Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
          (Attachment *this,VkBool32 _blendEnable,VkBlendFactor _srcColorBlendFactor,
          VkBlendFactor _dstColorBlendFactor,VkBlendOp _colorBlendOp,
          VkBlendFactor _srcAlphaBlendFactor,VkBlendFactor _dstAlphaBlendFactor,
          VkBlendOp _alphaBlendOp,VkColorComponentFlags _colorWriteMask)

{
  (this->super_VkPipelineColorBlendAttachmentState).blendEnable = _blendEnable;
  (this->super_VkPipelineColorBlendAttachmentState).srcColorBlendFactor = _srcColorBlendFactor;
  (this->super_VkPipelineColorBlendAttachmentState).dstColorBlendFactor = _dstColorBlendFactor;
  (this->super_VkPipelineColorBlendAttachmentState).colorBlendOp = _colorBlendOp;
  (this->super_VkPipelineColorBlendAttachmentState).srcAlphaBlendFactor = _srcAlphaBlendFactor;
  (this->super_VkPipelineColorBlendAttachmentState).dstAlphaBlendFactor = _dstAlphaBlendFactor;
  (this->super_VkPipelineColorBlendAttachmentState).alphaBlendOp = _alphaBlendOp;
  (this->super_VkPipelineColorBlendAttachmentState).colorWriteMask = _colorWriteMask;
  return;
}

Assistant:

PipelineCreateInfo::ColorBlendState::Attachment::Attachment (vk::VkBool32				_blendEnable,
															 vk::VkBlendFactor			_srcColorBlendFactor,
															 vk::VkBlendFactor			_dstColorBlendFactor,
															 vk::VkBlendOp				_colorBlendOp,
															 vk::VkBlendFactor			_srcAlphaBlendFactor,
															 vk::VkBlendFactor			_dstAlphaBlendFactor,
															 vk::VkBlendOp				_alphaBlendOp,
															 vk::VkColorComponentFlags	_colorWriteMask)
{
	blendEnable			= _blendEnable;
	srcColorBlendFactor	= _srcColorBlendFactor;
	dstColorBlendFactor	= _dstColorBlendFactor;
	colorBlendOp		= _colorBlendOp;
	srcAlphaBlendFactor	= _srcAlphaBlendFactor;
	dstAlphaBlendFactor	= _dstAlphaBlendFactor;
	alphaBlendOp		= _alphaBlendOp;
	colorWriteMask		= _colorWriteMask;
}